

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void pmuldq_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  undefined8 uVar3;
  
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
    if ((pMyDisasm->Prefix).OperandSize != '\x01') {
LAB_0012c91c:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      return;
    }
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
      (pMyDisasm->Instruction).Category = 0x80000;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pmuldq",7);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpmuldq",8);
LAB_0012c97f:
    ArgsVEX(pMyDisasm);
    return;
  }
  UVar1 = (pMyDisasm->Reserved_).VEX.pp;
  if (UVar1 == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpmuldq",8);
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    goto LAB_0012c97f;
  }
  if (UVar1 != '\x02') goto LAB_0012c91c;
  if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
    uVar3 = 0x62326d766f6d7076;
  }
  else {
    uVar3 = 0x77326d766f6d7076;
  }
  *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar3;
  (pMyDisasm->Instruction).Mnemonic[8] = '\0';
  if ((pMyDisasm->Reserved_).EVEX.vvvv != '\x0f') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  (pMyDisasm->Instruction).Category = 0x140000;
  UVar1 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar1 == '\0') {
    IVar2 = 4;
  }
  else if (UVar1 == '\x01') {
    IVar2 = 8;
  }
  else {
    IVar2 = 0x10;
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_0012ca4b;
  }
  (pMyDisasm->Reserved_).Register_ = IVar2;
LAB_0012ca4b:
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 0x400;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  if ((pMyDisasm->Reserved_).MOD_ != 3) {
    (pMyDisasm->Reserved_).MemDecoration = 0x69;
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ pmuldq_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 2) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmovm2b");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmovm2w");
        #endif
      }
      if (GV.EVEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      if (GV.VEX.L == 0) {
        GV.Register_ = SSE_REG;
      }
      else if (GV.VEX.L == 0x1) {
        GV.Register_ = AVX_REG;
      }
      else if (GV.EVEX.LL == 0x2) {
        GV.Register_ = AVX512_REG;
      }
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = OPMASK_REG;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);

      if (GV.MOD_ != 3) {
        GV.MemDecoration = Arg2multibytes;
        GV.ERROR_OPCODE = UD_;
      }
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else if (GV.VEX.pp == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmuldq");
      #endif
      GV.EVEX.tupletype = FULL;
      ArgsVEX(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    /* ========== 0x66 */
    GV.OperandSize = GV.OriginalOperandSize;
    pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
    if (GV.VEX.state == InUsePrefix) {
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmuldq");
      #endif
      ArgsVEX(pMyDisasm);
    } else {
      pMyDisasm->Instruction.Category = SSE41_INSTRUCTION;
      GV.MemDecoration = Arg2_m128_xmm;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pmuldq");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}